

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

handle pybind11::detail::find_registered_python_instance(void *src,type_info *tinfo)

{
  PyTypeObject *type;
  long *plVar1;
  char *__s1;
  int iVar2;
  internals *piVar3;
  _Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false> _Var4;
  _Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>
  _Var5;
  handle *phVar6;
  long *plVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false,_false>_>
  pVar8;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar9;
  void *local_40;
  handle local_38;
  
  local_40 = src;
  piVar3 = get_internals();
  pVar8 = std::
          _Hashtable<const_void_*,_std::pair<const_void_*const,_pybind11::detail::instance_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range(&(piVar3->registered_instances)._M_h,&local_40);
  _Var4._M_cur = (__node_type *)
                 pVar8.first.
                 super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                 ._M_cur;
  do {
    if ((_Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>)
        _Var4._M_cur ==
        pVar8.second.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
       ) {
      return (handle)(PyObject *)0x0;
    }
    type = *(PyTypeObject **)
            (*(long *)((long)&((_Var4._M_cur)->
                              super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                              ._M_storage._M_storage + 8) + 8);
    pVar9 = all_type_info_get_cache(type);
    _Var5 = pVar9.first.
            super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
            ._M_cur;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      all_type_info_populate
                (type,(vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                       *)((long)_Var5.
                                super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                ._M_cur + 0x10));
    }
    plVar1 = *(long **)((long)_Var5.
                              super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                              ._M_cur + 0x18);
    for (plVar7 = *(long **)((long)_Var5.
                                   super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
                                   ._M_cur + 0x10); plVar7 != plVar1; plVar7 = plVar7 + 1) {
      if (*plVar7 != 0) {
        __s1 = *(char **)(*(long *)(*plVar7 + 8) + 8);
        if ((__s1 == *(char **)(tinfo->cpptype + 8)) ||
           ((*__s1 != '*' && (iVar2 = strcmp(__s1,*(char **)(tinfo->cpptype + 8)), iVar2 == 0)))) {
          local_38.m_ptr =
               *(PyObject **)
                ((long)&((_Var4._M_cur)->
                        super__Hash_node_value<std::pair<const_void_*const,_pybind11::detail::instance_*>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_void_*const,_pybind11::detail::instance_*>_>
                        ._M_storage._M_storage + 8);
          phVar6 = handle::inc_ref(&local_38);
          return (handle)phVar6->m_ptr;
        }
      }
    }
    _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
  } while( true );
}

Assistant:

PYBIND11_NOINLINE handle find_registered_python_instance(void *src,
                                                         const detail::type_info *tinfo) {
    return with_instance_map(src, [&](instance_map &instances) {
        auto it_instances = instances.equal_range(src);
        for (auto it_i = it_instances.first; it_i != it_instances.second; ++it_i) {
            for (auto *instance_type : detail::all_type_info(Py_TYPE(it_i->second))) {
                if (instance_type && same_type(*instance_type->cpptype, *tinfo->cpptype)) {
                    return handle((PyObject *) it_i->second).inc_ref();
                }
            }
        }
        return handle();
    });
}